

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmPMove<(moira::Instr)184,(moira::Mode)10,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  u32 ext;
  uint uVar5;
  StrWriter *this_00;
  Syntax SVar6;
  char *str_00;
  Int i;
  Int i_00;
  char *str_01;
  Moira *this_01;
  byte bVar7;
  uint uVar8;
  char *str_02;
  ushort local_70;
  undefined1 local_44 [20];
  
  uVar1 = *addr;
  this_01 = this;
  ext = dasmIncRead<2>(this,addr);
  SVar6 = str->style->syntax;
  if ((SVar6 & ~MOIRA_MIT) == GNU) {
    bVar4 = isValidExtMMU(this_01,PMOVE,IXPC,op,ext);
    if (!bVar4) {
      *addr = uVar1;
      dasmIllegal<(moira::Instr)184,(moira::Mode)10,0>(this,str,addr,op);
      return;
    }
    SVar6 = str->style->syntax;
  }
  local_70 = op & 7;
  uVar8 = ext >> 0xd & 7;
  uVar5 = ext >> 10;
  str_00 = "%";
  str_01 = "";
  if ((SVar6 & ~GNU) != MOIRA_MIT) {
    str_00 = "";
  }
  str_02 = "fd";
  if ((ext >> 8 & 1) == 0) {
    str_02 = "";
  }
  if (uVar8 != 3) {
    if (uVar8 == 2) {
      switch(uVar5 & 7) {
      case 0:
        str_01 = "tc";
        break;
      case 1:
        str_01 = "drp";
        break;
      case 2:
        str_01 = "srp";
        break;
      case 3:
        str_01 = "crp";
        break;
      case 4:
        str_01 = "cal";
        break;
      case 5:
        str_01 = "val";
        break;
      case 6:
        str_01 = "scc";
        break;
      case 7:
        str_01 = "ac";
      }
    }
    else {
      if (uVar8 != 0) {
LAB_002f20a0:
        bVar3 = false;
        goto switchD_002f20df_default;
      }
      if ((uVar5 & 7) == 3) {
        str_01 = "tt1";
      }
      else {
        if ((uVar5 & 7) != 2) goto LAB_002f20a0;
        str_01 = "tt0";
      }
    }
    bVar2 = true;
    bVar4 = false;
    goto switchD_002f20df_caseD_2;
  }
  bVar4 = false;
  bVar2 = false;
  bVar3 = false;
  switch(uVar5 & 7) {
  case 0:
    str_01 = "psr";
    break;
  case 1:
    str_01 = "pcsr";
    break;
  case 2:
  case 3:
    goto switchD_002f20df_caseD_2;
  case 4:
    str_01 = "bad";
    break;
  case 5:
    str_01 = "bac";
    break;
  default:
    goto switchD_002f20df_default;
  }
  bVar3 = true;
switchD_002f20df_default:
  bVar4 = bVar3;
  bVar2 = false;
switchD_002f20df_caseD_2:
  bVar7 = (byte)(ext >> 2) & 7;
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,str_02);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  if ((ext >> 9 & 1) == 0) {
    if (bVar4) {
      Op<(moira::Mode)10,2>((Ea<(moira::Mode)10,_2> *)local_44,this,local_70,addr);
      StrWriter::operator<<(str,(Ea<(moira::Mode)10,_2> *)local_44);
      StrWriter::operator<<(str);
    }
    if (bVar2) {
      Op<(moira::Mode)10,4>((Ea<(moira::Mode)10,_4> *)local_44,this,local_70,addr);
      StrWriter::operator<<(str,(Ea<(moira::Mode)10,_4> *)local_44);
      StrWriter::operator<<(str);
    }
    StrWriter::operator<<(str,str_00);
    StrWriter::operator<<(str,str_01);
    if ((ext & 0x1800) != 0 && uVar8 == 3) {
      i.raw._1_3_ = 0;
      i.raw._0_1_ = bVar7;
      StrWriter::operator<<(str,i);
    }
  }
  else {
    if ((ext & 0x1800) != 0 && uVar8 == 3) {
      i_00.raw._1_3_ = 0;
      i_00.raw._0_1_ = bVar7;
      StrWriter::operator<<(str,i_00);
    }
    StrWriter::operator<<(str,str_00);
    StrWriter::operator<<(str,str_01);
    if (bVar4) {
      StrWriter::operator<<(str);
      Op<(moira::Mode)10,2>((Ea<(moira::Mode)10,_2> *)local_44,this,local_70,addr);
      StrWriter::operator<<(str,(Ea<(moira::Mode)10,_2> *)local_44);
    }
    if (bVar2) {
      StrWriter::operator<<(str);
      Op<(moira::Mode)10,4>((Ea<(moira::Mode)10,_4> *)local_44,this,local_70,addr);
      StrWriter::operator<<(str,(Ea<(moira::Mode)10,_4> *)local_44);
    }
  }
  return;
}

Assistant:

void
Moira::dasmPMove(StrWriter &str, u32 &addr, u16 op) const
{
    auto old  = addr;
    auto ext  = dasmIncRead<Word>(addr);
    auto reg  = _____________xxx (op);
    auto fmt  = xxx_____________ (ext);
    auto preg = ___xxx__________ (ext);
    auto nr   = ___________xxx__ (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    const char *prefix = str.style.syntax == Syntax::GNU_MIT || str.style.syntax == Syntax::MOIRA_MIT ? "%" : "";
    const char *suffix = (ext & 0x100) ? "fd" : "";
    const char *r = "";
    Size s = Size(Unsized);

    switch (fmt) {

        case 0:

            switch (preg) {

                case 0b010: r = "tt0";  s = Long; break;
                case 0b011: r = "tt1";  s = Long; break;
            }
            break;

        case 2:

            switch (preg) {

                case 0b000: r = "tc";   s = Long; break;
                case 0b001: r = "drp";  s = Long; break;
                case 0b010: r = "srp";  s = Long; break;
                case 0b011: r = "crp";  s = Long; break;
                case 0b100: r = "cal";  s = Long; break;
                case 0b101: r = "val";  s = Long; break;
                case 0b110: r = "scc";  s = Long; break;
                case 0b111: r = "ac";   s = Long; break;
            }
            break;

        case 3:

            switch (preg) {

                case 0b000: r = "psr";  s = Word; break;
                case 0b001: r = "pcsr"; s = Word; break;
                case 0b100: r = "bad";  s = Word; break;
                case 0b101: r = "bac";  s = Word; break;
            }
            break;
    }

    if (!(ext & 0x200)) {

        str << Ins<I>{} << suffix << str.tab;
        if (s == Word) str << Op<M, Word>(reg, addr) << Sep{};
        if (s == Long) str << Op<M, Long>(reg, addr) << Sep{};
        str << prefix << r;
        if (fmt == 3 && preg > 1) str << Int(nr);

    } else {

        str << Ins<I>{} << suffix << str.tab;
        if (fmt == 3 && preg > 1) str << Int(nr);
        str << prefix << r;
        if (s == Word) str << Sep{} << Op<M, Word>(reg, addr);
        if (s == Long) str << Sep{} << Op<M, Long>(reg, addr);
    }
}